

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_find_polygon_degeneracies.cc
# Opt level: O1

vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_> *
s2builderutil::FindPolygonDegeneracies
          (vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
           *__return_storage_ptr__,Graph *g,S2Error *error)

{
  pair<int,_bool> *ppVar1;
  pointer *ppPVar2;
  pointer pcVar3;
  double dVar4;
  int iVar5;
  pair<int,_int> pVar6;
  pointer pVVar7;
  pointer pPVar8;
  iterator __position;
  S2Error *pSVar9;
  pointer pCVar10;
  pointer pSVar11;
  Graph *pGVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  PolygonDegeneracy PVar17;
  ulong uVar18;
  pointer ppVar19;
  pointer pCVar20;
  pointer pCVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  Component *component;
  ulong uVar27;
  ulong uVar28;
  pointer pCVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  PolygonDegeneracy *d;
  pointer pCVar33;
  pointer pPVar34;
  EdgeId e;
  pointer pSVar35;
  vector<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
  components;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> crossing_edges;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> frontier;
  S2CrossingEdgeQuery query;
  int local_2b4;
  int local_298;
  uint local_294;
  vector<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
  local_288;
  __uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_> local_268;
  ulong local_260;
  S2Error *local_258;
  undefined1 local_250 [12];
  undefined4 uStack_244;
  iterator iStack_240;
  PolygonDegeneracy *pPStack_238;
  double local_230;
  bool local_228;
  VType local_220;
  VType VStack_218;
  VType local_210;
  VType VStack_208;
  VType local_200;
  VType VStack_1f8;
  S2Point *local_1f0;
  ulong local_1e0;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> local_1d8;
  MutableS2ShapeIndex local_1b8;
  S2CrossingEdgeQuery local_158;
  DegeneracyFinder local_100;
  
  anon_unknown_0::CheckGraphOptions(g);
  if ((g->options_).sibling_pairs_ == DISCARD && (g->options_).degenerate_edges_ == DISCARD) {
    (__return_storage_ptr__->
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_100.g_ = g;
    S2Builder::Graph::VertexInMap::VertexInMap(&local_100.in_,g);
    S2Builder::Graph::VertexOutMap::VertexOutMap(&local_100.out_,local_100.g_);
    local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_100.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_100.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_100.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_100.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_100.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_258 = error;
    std::vector<bool,_std::allocator<bool>_>::resize
              (&local_100.is_edge_degeneracy_,
               (long)(int)((ulong)((long)((local_100.g_)->edges_->
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)((local_100.g_)->edges_->
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3),false);
    uVar26 = 0;
    std::vector<bool,_std::allocator<bool>_>::resize
              (&local_100.is_vertex_unbalanced_,(long)(local_100.g_)->num_vertices_,false);
    ppVar19 = ((local_100.g_)->edges_->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar25 = (uint)((ulong)((long)((local_100.g_)->edges_->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar19) >> 3)
    ;
    if (0 < (int)uVar25) {
      uVar18 = 0;
      uVar30 = 0;
      uVar26 = 0;
      do {
        pVar6 = ppVar19[uVar18];
        iVar22 = pVar6.first;
        iVar16 = pVar6.second;
        if (iVar22 == iVar16) {
LAB_001cdb84:
          local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar18 >> 6] =
               local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar18 >> 6] |
               1L << ((byte)uVar18 & 0x3f);
          uVar26 = uVar26 + 1;
        }
        else {
          uVar31 = uVar30;
          if ((int)uVar30 < (int)uVar25) {
            lVar32 = (long)(int)uVar30 << 0x20;
            bVar13 = true;
            lVar23 = (long)(int)uVar30;
            do {
              if ((iVar22 <= ppVar19[local_100.in_.in_edge_ids_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar23]].second) &&
                 ((iVar22 < ppVar19[local_100.in_.in_edge_ids_.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar23]].second ||
                  (iVar16 <= ppVar19[local_100.in_.in_edge_ids_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar23]].first)))) {
                uVar31 = uVar30;
                if ((bVar13) &&
                   ((iVar5 = *(int *)((long)local_100.in_.in_edge_ids_.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start + (lVar32 >> 0x1e)),
                    ppVar19[iVar5].second == iVar22 && (ppVar19[iVar5].first == iVar16))))
                goto LAB_001cdb84;
                break;
              }
              bVar13 = lVar23 + 1 < (long)(ulong)(uVar25 & 0x7fffffff);
              lVar32 = lVar32 + 0x100000000;
              uVar30 = uVar30 + 1;
              uVar31 = uVar25;
              lVar23 = lVar23 + 1;
            } while (uVar25 != uVar30);
          }
          uVar24 = (ulong)iVar22;
          uVar28 = uVar24 + 0x3f;
          if (-1 < (long)uVar24) {
            uVar28 = uVar24;
          }
          local_100.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
          [((long)uVar28 >> 6) + ((ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001) - 1)]
               = local_100.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar28 >> 6) +
                  ((ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                 1L << ((byte)pVar6.first & 0x3f);
          uVar30 = uVar31;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != (uVar25 & 0x7fffffff));
    }
    if (uVar26 == 0) {
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_250._0_8_ = (S2Error *)CONCAT44(local_250._4_4_,local_250._0_4_);
      unique0x100022a4 = (ostream *)CONCAT44(uStack_244,local_250._8_4_);
      iStack_240._M_current =
           (PolygonDegeneracy *)CONCAT44(iStack_240._M_current._4_4_,iStack_240._M_current._0_4_);
    }
    else if (uVar26 == uVar25) {
      local_250._0_4_ = SUB84(local_258,0);
      local_250._4_4_ = (undefined4)((ulong)local_258 >> 0x20);
      if (((local_100.g_)->is_full_polygon_predicate_).super__Function_base._M_manager ==
          (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar13 = (*((local_100.g_)->is_full_polygon_predicate_)._M_invoker)
                         ((_Any_data *)&(local_100.g_)->is_full_polygon_predicate_,local_100.g_,
                          (S2Error **)local_250);
      std::
      vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>::
      vector(__return_storage_ptr__,
             (long)(int)((ulong)((long)((local_100.g_)->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)((local_100.g_)->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3),
             (allocator_type *)local_250);
      local_250._0_8_ = (S2Error *)CONCAT44(local_250._4_4_,local_250._0_4_);
      unique0x10002294 = (ostream *)CONCAT44(uStack_244,local_250._8_4_);
      iStack_240._M_current =
           (PolygonDegeneracy *)CONCAT44(iStack_240._M_current._4_4_,iStack_240._M_current._0_4_);
      if (0 < (int)((ulong)((long)((local_100.g_)->edges_->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_100.g_)->edges_->
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar23 = 0;
        do {
          (__return_storage_ptr__->
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          )._M_impl.super__Vector_impl_data._M_start[lVar23] =
               (PolygonDegeneracy)((uint)bVar13 * -0x80000000 + (int)lVar23);
          lVar23 = lVar23 + 1;
          local_250._0_8_ = (S2Error *)CONCAT44(local_250._4_4_,local_250._0_4_);
          unique0x100022ac = (ostream *)CONCAT44(uStack_244,local_250._8_4_);
          iStack_240._M_current =
               (PolygonDegeneracy *)
               CONCAT44(iStack_240._M_current._4_4_,iStack_240._M_current._0_4_);
        } while (lVar23 < (int)((ulong)((long)((local_100.g_)->edges_->
                                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)((local_100.g_)->edges_->
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
    }
    else {
      local_288.
      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.
      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.
      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b4 = 0;
      std::vector<bool,_std::allocator<bool>_>::resize
                (&local_100.is_vertex_used_,(long)(local_100.g_)->num_vertices_,false);
      ppVar19 = ((local_100.g_)->edges_->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)((local_100.g_)->edges_->
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar19) >> 3) < 1
         ) {
        local_294 = 0xffffffff;
        local_298 = 0;
      }
      else {
        local_294 = 0xffffffff;
        uVar18 = 0;
        local_298 = 0;
        local_2b4 = 0;
        do {
          if ((local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar18 >> 6] >>
               (uVar18 & 0x3f) & 1) != 0) {
            PVar17 = (PolygonDegeneracy)ppVar19[uVar18].first;
            uVar24 = (ulong)(int)PVar17;
            uVar28 = uVar24 + 0x3f;
            if (-1 < (long)uVar24) {
              uVar28 = uVar24;
            }
            uVar27 = (ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001);
            local_1e0 = uVar18;
            if ((local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar28 >> 6) + (uVar27 - 1)] >> (uVar24 & 0x3f) & 1) == 0) {
              iStack_240._M_current._4_4_ = 0;
              pPStack_238 = (PolygonDegeneracy *)0x0;
              local_250._4_4_ = 0;
              local_250._8_4_ = 0;
              uStack_244 = 0;
              iStack_240._M_current._0_4_ = 0;
              local_1b8.super_S2ShapeIndex._vptr_S2ShapeIndex = (_func_int **)0x0;
              local_1b8.shapes_.
              super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1b8.shapes_.
              super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_158.index_ = (S2ShapeIndex *)CONCAT35(local_158.index_._5_3_,0x100000000);
              local_158.index_ = (S2ShapeIndex *)CONCAT44(local_158.index_._4_4_,PVar17);
              local_260 = uVar24;
              local_250._0_4_ = PVar17;
              std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::
              _M_realloc_insert<std::pair<int,bool>>
                        ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>> *)
                         &local_1b8,(iterator)0x0,(pair<int,_bool> *)&local_158);
              local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
              [((long)uVar28 >> 6) + (uVar27 - 1)] =
                   local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar28 >> 6) + (uVar27 - 1)] | 1L << (PVar17._0_1_ & 0x3f);
              while ((pointer)local_1b8.super_S2ShapeIndex._vptr_S2ShapeIndex !=
                     local_1b8.shapes_.
                     super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
                ppVar1 = (pair<int,_bool> *)
                         (local_1b8.shapes_.
                          super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + -1);
                iVar22 = ((pair<int,_bool> *)
                         (local_1b8.shapes_.
                          super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + -1))->first;
                uVar18 = (ulong)iVar22;
                bVar13 = ((pair<int,_bool> *)
                         (local_1b8.shapes_.
                          super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + -1))->second;
                local_1b8.shapes_.
                super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar1;
                if (local_250._4_4_ == 0) {
                  uVar28 = uVar18 + 0x3f;
                  if (-1 < (long)uVar18) {
                    uVar28 = uVar18;
                  }
                  if ((local_100.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>.
                       _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar28 >> 6) +
                        ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar18 & 0x3f) & 1) != 0) {
                    iVar16 = anon_unknown_0::DegeneracyFinder::ContainsVertexSign(&local_100,iVar22)
                    ;
                    if (iVar16 == 0) {
                      S2LogMessage::S2LogMessage
                                ((S2LogMessage *)&local_158,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_find_polygon_degeneracies.cc"
                                 ,0xe2,kFatal,(ostream *)&std::cerr);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_158.a0_.c_[0],"Check failed: (v0_sign) != (0) ",
                                 0x1f);
                      goto LAB_001ce9d4;
                    }
                    local_250._4_4_ = -iVar16;
                    if (bVar13 != false) {
                      local_250._4_4_ = iVar16;
                    }
                  }
                }
                uVar28 = (ulong)local_100.out_.edge_begins_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar18];
                local_258 = (S2Error *)
                            CONCAT44(local_258._4_4_,
                                     local_100.out_.edge_begins_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar18 + 1]);
                if (local_100.out_.edge_begins_.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar18] !=
                    local_100.out_.edge_begins_.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar18 + 1]) {
                  do {
                    iVar16 = ((local_100.g_)->edges_->
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar28].second;
                    bVar15 = anon_unknown_0::DegeneracyFinder::CrossingParity
                                       (&local_100,iVar22,iVar16,false);
                    uVar18 = uVar28 + 0x3f;
                    if (-1 < (long)uVar28) {
                      uVar18 = uVar28;
                    }
                    if ((local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>.
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar18 >> 6) +
                          ((ulong)((uVar28 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                         (uVar28 & 0x3f) & 1) != 0) {
                      PVar17 = (PolygonDegeneracy)
                               ((uint)(bVar13 != bVar15) << 0x1f | (uint)uVar28 & 0x7fffffff);
                      local_158.index_ = (S2ShapeIndex *)CONCAT44(local_158.index_._4_4_,PVar17);
                      if (iStack_240._M_current == pPStack_238) {
                        std::
                        vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                        ::_M_realloc_insert<s2builderutil::PolygonDegeneracy>
                                  ((vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                                    *)(local_250 + 8),iStack_240,(PolygonDegeneracy *)&local_158);
                      }
                      else {
                        *iStack_240._M_current = PVar17;
                        iStack_240._M_current = iStack_240._M_current + 1;
                      }
                    }
                    uVar24 = (ulong)iVar16;
                    uVar18 = uVar24 + 0x3f;
                    if (-1 < (long)uVar24) {
                      uVar18 = uVar24;
                    }
                    uVar27 = (ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001);
                    if ((local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>.
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar18 >> 6) + (uVar27 - 1)] >> (uVar24 & 0x3f) & 1) == 0) {
                      bVar14 = anon_unknown_0::DegeneracyFinder::CrossingParity
                                         (&local_100,iVar16,iVar22,true);
                      local_158.index_ =
                           (S2ShapeIndex *)
                           CONCAT44(CONCAT31(local_158.index_._5_3_,(bVar13 != bVar15) != bVar14),
                                    iVar16);
                      if (local_1b8.shapes_.
                          super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start ==
                          local_1b8.shapes_.
                          super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
                        std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::
                        _M_realloc_insert<std::pair<int,bool>>
                                  ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>
                                    *)&local_1b8,
                                   (iterator)
                                   local_1b8.shapes_.
                                   super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (pair<int,_bool> *)&local_158);
                      }
                      else {
                        *local_1b8.shapes_.
                         super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start =
                             (unique_ptr<S2Shape,_std::default_delete<S2Shape>_>)local_158.index_;
                        local_1b8.shapes_.
                        super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             local_1b8.shapes_.
                             super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1;
                      }
                      local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [((long)uVar18 >> 6) + (uVar27 - 1)] =
                           local_100.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>.
                           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar18 >> 6) + (uVar27 - 1)] | 1L << ((byte)iVar16 & 0x3f);
                    }
                    uVar28 = uVar28 + 1;
                  } while ((int)local_258 != (int)uVar28);
                }
              }
              if ((pair<int,_bool> *)local_1b8.super_S2ShapeIndex._vptr_S2ShapeIndex !=
                  (pair<int,_bool> *)0x0) {
                operator_delete(local_1b8.super_S2ShapeIndex._vptr_S2ShapeIndex);
              }
              pCVar29 = local_288.
                        super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pCVar10 = local_288.
                        super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar13 = local_250._4_4_ == 0;
              local_260 = local_260 & 0xffffffff;
              iVar22 = local_250._4_4_;
              if (bVar13) {
                local_260 = (ulong)local_294;
                iVar22 = local_2b4;
              }
              if (local_288.
                  super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_288.
                  super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                if ((long)local_288.
                          super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_288.
                          super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar28 = (long)local_288.
                               super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_288.
                               super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
                uVar18 = uVar28;
                if (local_288.
                    super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_288.
                    super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  uVar18 = 1;
                }
                uVar24 = uVar18 + uVar28;
                if (0x3fffffffffffffe < uVar24) {
                  uVar24 = 0x3ffffffffffffff;
                }
                if (CARRY8(uVar18,uVar28)) {
                  uVar24 = 0x3ffffffffffffff;
                }
                if (uVar24 == 0) {
                  pCVar20 = (pointer)0x0;
                }
                else {
                  pCVar20 = (pointer)operator_new(uVar24 << 5);
                }
                pCVar33 = pCVar20 + uVar28;
                pCVar33->root = local_250._0_4_;
                pCVar33->root_sign = local_250._4_4_;
                std::
                vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                ::vector(&pCVar33->degeneracies,
                         (vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                          *)(local_250 + 8));
                pCVar33 = pCVar20;
                for (pCVar21 = pCVar10; pCVar29 != pCVar21; pCVar21 = pCVar21 + 1) {
                  iVar16 = pCVar21->root_sign;
                  pCVar33->root = pCVar21->root;
                  pCVar33->root_sign = iVar16;
                  (pCVar33->degeneracies).
                  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pCVar21->degeneracies).
                       super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  (pCVar33->degeneracies).
                  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pCVar21->degeneracies).
                       super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  (pCVar33->degeneracies).
                  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pCVar21->degeneracies).
                       super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  (pCVar21->degeneracies).
                  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  (pCVar21->degeneracies).
                  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  (pCVar21->degeneracies).
                  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  pCVar33 = pCVar33 + 1;
                }
                if (pCVar10 != (pointer)0x0) {
                  operator_delete(pCVar10);
                }
                local_288.
                super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar20 + uVar24;
                local_288.
                super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                ._M_impl.super__Vector_impl_data._M_start = pCVar20;
              }
              else {
                (local_288.
                 super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->root = local_250._0_4_;
                (local_288.
                 super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->root_sign = local_250._4_4_;
                std::
                vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                ::vector(&(local_288.
                           super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->degeneracies,
                         (vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                          *)(local_250 + 8));
                pCVar33 = pCVar29;
              }
              uVar18 = local_1e0;
              local_288.
              super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
              ._M_impl.super__Vector_impl_data._M_finish = pCVar33 + 1;
              if ((void *)CONCAT44(uStack_244,local_250._8_4_) != (void *)0x0) {
                operator_delete((void *)CONCAT44(uStack_244,local_250._8_4_));
              }
              local_298 = local_298 + (uint)bVar13;
              local_294 = (uint)local_260;
              local_2b4 = iVar22;
            }
          }
          uVar18 = uVar18 + 1;
          ppVar19 = ((local_100.g_)->edges_->
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while ((long)uVar18 <
                 (long)(int)((ulong)((long)((local_100.g_)->edges_->
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppVar19) >> 3));
      }
      if (0 < local_298) {
        if (local_2b4 == 0) {
          uVar18 = (ulong)(local_100.g_)->num_vertices_;
          if ((long)uVar18 < 1) {
LAB_001ce9d9:
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)local_250,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_find_polygon_degeneracies.cc"
                       ,0x118,kFatal,(ostream *)&std::cerr);
            std::operator<<((ostream *)CONCAT44(uStack_244,local_250._8_4_),
                            "Could not find previously marked unbalanced vertex");
LAB_001ce9d4:
            abort();
          }
          if ((*local_100.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) == 0) {
            uVar28 = 0;
            do {
              if (uVar18 - 1 == uVar28) goto LAB_001ce9d9;
              uVar28 = uVar28 + 1;
            } while ((local_100.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [uVar28 >> 6] >> (uVar28 & 0x3f) & 1) == 0);
            bVar13 = uVar28 < uVar18;
          }
          else {
            bVar13 = true;
            uVar28 = 0;
          }
          local_294 = (uint)uVar28;
          if (!bVar13) goto LAB_001ce9d9;
          local_2b4 = anon_unknown_0::DegeneracyFinder::ContainsVertexSign(&local_100,local_294);
        }
        pCVar10 = local_288.
                  super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_298 < 0x15) {
          iStack_240._M_current = (PolygonDegeneracy *)0x0;
          pPStack_238 = (PolygonDegeneracy *)0x0;
          local_230 = 0.0;
          local_220 = 0.0;
          VStack_218 = 0.0;
          local_210 = 0.0;
          VStack_208 = 0.0;
          local_200 = 0.0;
          VStack_1f8 = 0.0;
          if (local_288.
              super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_288.
              super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pCVar29 = local_288.
                      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              if (pCVar29->root_sign == 0) {
                pVVar7 = ((local_100.g_)->vertices_->
                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                local_250._0_8_ = pVVar7 + (int)local_294;
                unique0x00004a80 = (ostream *)(pVVar7 + pCVar29->root);
                pcVar3 = (((S2Error *)local_250._0_8_)->text_)._M_dataplus._M_p;
                dVar4 = (double)(((S2Error *)local_250._0_8_)->text_)._M_string_length;
                iStack_240._M_current =
                     (PolygonDegeneracy *)
                     ((double)pcVar3 * *(double *)&unique0x00004a80->field_0x10 -
                     dVar4 * *(double *)&unique0x00004a80->field_0x8);
                pPStack_238 = (PolygonDegeneracy *)
                              (dVar4 * (double)unique0x00004a80->_vptr_basic_ostream -
                              *(double *)&unique0x00004a80->field_0x10 *
                              *(double *)&((S2Error *)local_250._0_8_)->code_);
                local_230 = *(double *)&unique0x00004a80->field_0x8 *
                            *(double *)&((S2Error *)local_250._0_8_)->code_ -
                            (double)pcVar3 * (double)unique0x00004a80->_vptr_basic_ostream;
                local_228 = false;
                local_1f0 = (S2Point *)0x0;
                ppVar19 = ((local_100.g_)->edges_->
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                bVar13 = 0 < local_2b4;
                if (0 < (int)((ulong)((long)((local_100.g_)->edges_->
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppVar19) >> 3)) {
                  uVar18 = 0;
                  do {
                    if ((local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>.
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [uVar18 >> 6] >> (uVar18 & 0x3f) & 1) == 0) {
                      pVVar7 = ((local_100.g_)->vertices_->
                               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      bVar15 = S2EdgeCrosser::EdgeOrVertexCrossing
                                         ((S2EdgeCrosser *)local_250,pVVar7 + ppVar19[uVar18].first,
                                          pVVar7 + ppVar19[uVar18].second);
                      bVar13 = (bool)(bVar15 ^ bVar13);
                    }
                    uVar18 = uVar18 + 1;
                    ppVar19 = ((local_100.g_)->edges_->
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                  } while ((long)uVar18 <
                           (long)(int)((ulong)((long)((local_100.g_)->edges_->
                                                                                                          
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)ppVar19) >> 3));
                }
                pCVar29->root_sign = bVar13 - 1 | 1;
              }
              pCVar29 = pCVar29 + 1;
            } while (pCVar29 != pCVar10);
          }
        }
        else {
          MutableS2ShapeIndex::MutableS2ShapeIndex(&local_1b8);
          pGVar12 = local_100.g_;
          local_268._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
          super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
               (tuple<S2Shape_*,_std::default_delete<S2Shape>_>)operator_new(0x18);
          *(undefined4 *)
           ((long)local_268._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                  super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 8) = 0xffffffff;
          *(undefined ***)
           local_268._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
           super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl = &PTR__S2Shape_002c1420;
          *(Graph **)
           ((long)local_268._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                  super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x10) = pGVar12;
          MutableS2ShapeIndex::Add
                    (&local_1b8,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_268);
          if ((_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)
              local_268._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
              super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl != (S2Shape *)0x0) {
            (**(code **)(*(long *)local_268._M_t.
                                  super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                                  super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 8))();
          }
          local_268._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
          super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
               (tuple<S2Shape_*,_std::default_delete<S2Shape>_>)
               (_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)0x0;
          local_158.tmp_candidates_.
          super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_158.tmp_candidates_.
          super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.tmp_candidates_.
          super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.index_ = (S2ShapeIndex *)0x0;
          local_158.a0_.c_[0] = 0.0;
          local_158.a0_.c_[1] = 0.0;
          local_158.a1_.c_[0] = 0.0;
          local_158.a1_.c_[1] = 0.0;
          local_158.iter_.iter_._M_t.
          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl =
               (unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                )(__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
                  )0x0;
          S2CrossingEdgeQuery::Init(&local_158,&local_1b8.super_S2ShapeIndex);
          pCVar10 = local_288.
                    super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_1d8.
          super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.
          super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8.
          super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_230 = 0.0;
          iStack_240._M_current = (PolygonDegeneracy *)0x0;
          pPStack_238 = (PolygonDegeneracy *)0x0;
          local_220 = 0.0;
          VStack_218 = 0.0;
          local_210 = 0.0;
          VStack_208 = 0.0;
          local_200 = 0.0;
          VStack_1f8 = 0.0;
          if (local_288.
              super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_288.
              super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pCVar29 = local_288.
                      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iStack_240._M_current = (PolygonDegeneracy *)0x0;
            do {
              if (pCVar29->root_sign == 0) {
                pVVar7 = ((local_100.g_)->vertices_->
                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                local_250._0_8_ = pVVar7 + (int)local_294;
                unique0x00004a80 = (ostream *)(pVVar7 + pCVar29->root);
                iStack_240._M_current =
                     (PolygonDegeneracy *)
                     (pVVar7[(int)local_294].c_[1] * *(double *)&unique0x00004a80->field_0x10 -
                     pVVar7[(int)local_294].c_[2] * *(double *)&unique0x00004a80->field_0x8);
                pPStack_238 = (PolygonDegeneracy *)
                              (pVVar7[(int)local_294].c_[2] *
                               (double)unique0x00004a80->_vptr_basic_ostream -
                              *(double *)&unique0x00004a80->field_0x10 *
                              pVVar7[(int)local_294].c_[0]);
                local_230 = *(double *)&unique0x00004a80->field_0x8 * pVVar7[(int)local_294].c_[0] -
                            pVVar7[(int)local_294].c_[1] *
                            (double)unique0x00004a80->_vptr_basic_ostream;
                local_228 = false;
                local_1f0 = (S2Point *)0x0;
                pVVar7 = ((local_100.g_)->vertices_->
                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                S2CrossingEdgeQuery::GetCandidates
                          (&local_158,pVVar7 + (int)local_294,pVVar7 + pCVar29->root,
                           (S2Shape *)
                           *(pair<int,_bool> *)
                            local_1b8.shapes_.
                            super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,&local_1d8);
                pSVar11 = local_1d8.
                          super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                bVar13 = 0 < local_2b4;
                for (pSVar35 = local_1d8.
                               super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                               ._M_impl.super__Vector_impl_data._M_start; pSVar35 != pSVar11;
                    pSVar35 = pSVar35 + 1) {
                  uVar28 = (ulong)pSVar35->edge_id;
                  uVar18 = uVar28 + 0x3f;
                  if (-1 < (long)uVar28) {
                    uVar18 = uVar28;
                  }
                  if ((local_100.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>.
                       _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar18 >> 6) +
                        ((ulong)((uVar28 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar28 & 0x3f) & 1) == 0) {
                    ppVar19 = ((local_100.g_)->edges_->
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    pVVar7 = ((local_100.g_)->vertices_->
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)
                             ._M_impl.super__Vector_impl_data._M_start;
                    bVar15 = S2EdgeCrosser::EdgeOrVertexCrossing
                                       ((S2EdgeCrosser *)local_250,pVVar7 + ppVar19[uVar28].first,
                                        pVVar7 + ppVar19[uVar28].second);
                    bVar13 = (bool)(bVar15 ^ bVar13);
                  }
                }
                pCVar29->root_sign = bVar13 - 1 | 1;
              }
              pCVar29 = pCVar29 + 1;
            } while (pCVar29 != pCVar10);
          }
          if (local_1d8.
              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1d8.
                            super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          S2CrossingEdgeQuery::~S2CrossingEdgeQuery(&local_158);
          MutableS2ShapeIndex::~MutableS2ShapeIndex(&local_1b8);
        }
      }
      pCVar10 = local_288.
                super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_288.
          super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_288.
          super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pCVar29 = local_288.
                  super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar9 = (S2Error *)local_250._0_8_;
        do {
          local_250._4_4_ = (undefined4)((ulong)pSVar9 >> 0x20);
          uVar25 = pCVar29->root_sign;
          if (uVar25 == 0) {
            local_250._0_8_ = pSVar9;
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)local_250,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_find_polygon_degeneracies.cc"
                       ,0x15d,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (stack0xfffffffffffffdb8,"Check failed: (component.root_sign) != (0) ",0x2b);
            goto LAB_001ce9d4;
          }
          pPVar34 = (pCVar29->degeneracies).
                    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar8 = (pCVar29->degeneracies).
                   super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pPVar34 != pPVar8) {
            do {
              local_250._0_4_ = (uint)*pPVar34 ^ uVar25 & 0x80000000;
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                ::_M_realloc_insert<s2builderutil::PolygonDegeneracy>
                          (__return_storage_ptr__,__position,(PolygonDegeneracy *)local_250);
              }
              else {
                *__position._M_current = (PolygonDegeneracy)local_250._0_4_;
                ppPVar2 = &(__return_storage_ptr__->
                           super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppPVar2 = *ppPVar2 + 1;
              }
              pPVar34 = pPVar34 + 1;
              pSVar9 = (S2Error *)CONCAT44(local_250._4_4_,local_250._0_4_);
            } while (pPVar34 != pPVar8);
          }
          local_250._0_8_ = pSVar9;
          pCVar29 = pCVar29 + 1;
          pSVar9 = (S2Error *)local_250._0_8_;
        } while (pCVar29 != pCVar10);
      }
      pPVar34 = (__return_storage_ptr__->
                super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pPVar8 = (__return_storage_ptr__->
               super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar34 != pPVar8) {
        uVar18 = (long)pPVar8 - (long)pPVar34 >> 2;
        lVar23 = 0x3f;
        if (uVar18 != 0) {
          for (; uVar18 >> lVar23 == 0; lVar23 = lVar23 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<s2builderutil::PolygonDegeneracy*,std::vector<s2builderutil::PolygonDegeneracy,std::allocator<s2builderutil::PolygonDegeneracy>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pPVar34,pPVar8,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<s2builderutil::PolygonDegeneracy*,std::vector<s2builderutil::PolygonDegeneracy,std::allocator<s2builderutil::PolygonDegeneracy>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pPVar34,pPVar8);
      }
      std::
      vector<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
      ::~vector(&local_288);
    }
    anon_unknown_0::DegeneracyFinder::~DegeneracyFinder(&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<PolygonDegeneracy> FindPolygonDegeneracies(const Graph& g,
                                                  S2Error* error) {
  CheckGraphOptions(g);
  if (g.options().degenerate_edges() == DegenerateEdges::DISCARD &&
      g.options().sibling_pairs() == SiblingPairs::DISCARD) {
    return {};  // All degeneracies have already been discarded.
  }
  return DegeneracyFinder(&g).Run(error);
}